

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O3

void __thiscall CFFFileInput::~CFFFileInput(CFFFileInput *this)

{
  _List_node_base *p_Var1;
  pointer ppEVar2;
  pointer ppCVar3;
  _List_node_base *p_Var4;
  
  (this->super_Type2InterpreterImplementationAdapter).super_IType2InterpreterImplementation.
  _vptr_IType2InterpreterImplementation = (_func_int **)&PTR_ReadCharString_003a5ef0;
  FreeData(this);
  p_Var4 = (this->mAdditionalGlyphs).
           super__List_base<IndexElement_*,_std::allocator<IndexElement_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&this->mAdditionalGlyphs) {
    p_Var1 = p_Var4->_M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var1;
  }
  std::
  _Rb_tree<const_char_*,_std::pair<const_char_*const,_unsigned_short>,_std::_Select1st<std::pair<const_char_*const,_unsigned_short>_>,_StringLess,_std::allocator<std::pair<const_char_*const,_unsigned_short>_>_>
  ::~_Rb_tree(&(this->mStringToSID)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  ::~_Rb_tree(&(this->mNameToIndex)._M_t);
  CFFPrimitiveReader::~CFFPrimitiveReader(&this->mPrimitivesReader);
  ppEVar2 = (this->mEncodings).super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->mEncodings).
                                  super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2
                   );
  }
  ppCVar3 = (this->mCharSets).super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar3 != (pointer)0x0) {
    operator_delete(ppCVar3,(long)(this->mCharSets).
                                  super__Vector_base<CharSetInfo_*,_std::allocator<CharSetInfo_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar3)
    ;
  }
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_CharStrings_*>,_std::_Select1st<std::pair<const_long_long,_CharStrings_*>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_CharStrings_*>_>_>
  ::~_Rb_tree(&(this->mLocalSubrs)._M_t);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&(this->mName).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return;
}

Assistant:

CFFFileInput::~CFFFileInput(void)
{
	FreeData();
}